

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetJointActionHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,Index *jointActions)

{
  Index IVar1;
  int iVar2;
  const_reference pvVar3;
  undefined4 extraout_var;
  PlanningUnitMADPDiscrete *this_00;
  
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (&this->_m_firstJAHIforT,(ulong)t);
  IVar1 = Globals::CastLIndexToIndex(*pvVar3);
  this_00 = (PlanningUnitMADPDiscrete *)this->_m_madp;
  iVar2 = (*(this_00->super_PlanningUnit)._vptr_PlanningUnit[0xd])();
  IVar1 = ComputeHistoryIndex(this_00,t,IVar1,jointActions,CONCAT44(extraout_var,iVar2));
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointActionHistoryIndex(
        Index t, const Index jointActions[] ) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstJAHIforT.at(t)), 
                jointActions,
                GetNrJointActions()
                )
          );    
    /*size_t this_JAHI=_m_firstJAHIforT.at(t);
    size_t nrJA = GetNrJointActions();
    for (Index ts=0; ts<t; ts++)
    {
        int exponent = t-1 - ts;
        size_t b = (size_t) pow((double)nrJA, (double)(exponent));
        this_JAHI += jointActions[ts] * b;
    }
    return(this_JAHI);*/
}